

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Molecule * __thiscall OpenMD::SelectionManager::nthSelectedMolecule(SelectionManager *this,int *n)

{
  int iVar1;
  reference ppMVar2;
  long in_RDI;
  int i;
  OpenMDBitSet *in_stack_00000028;
  undefined8 local_28;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)(in_RDI + 8),5);
  iVar1 = OpenMDBitSet::nthOnBit(in_stack_00000028,(unsigned_long)this);
  if (iVar1 == -1) {
    local_28 = (value_type)0x0;
  }
  else {
    ppMVar2 = std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator[]
                        ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                         (in_RDI + 0xb0),(long)iVar1);
    local_28 = *ppMVar2;
  }
  return local_28;
}

Assistant:

Molecule* SelectionManager::nthSelectedMolecule(int& n) {
    int i;
#ifdef IS_MPI
    i = ss_.bitsets_[MOLECULE].nthOnBit(n);
    if (i == -1) return NULL;
    // check that this processor owns this molecule
    if (molecules_[i] != NULL) return molecules_[i];
    return NULL;
#else
    i = ss_.bitsets_[MOLECULE].nthOnBit(n);
    return i == -1 ? NULL : molecules_[i];
#endif
  }